

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

bool __thiscall
despot::option::PrintUsageImplementation::LinePartIterator::nextRow(LinePartIterator *this)

{
  bool bVar1;
  LinePartIterator *this_local;
  
  if (this->ptr == (char *)0x0) {
    restartRow(this);
    this_local._7_1_ = this->rowstart != (char *)0x0;
  }
  else {
    while( true ) {
      bVar1 = false;
      if (*this->ptr != '\0') {
        bVar1 = *this->ptr != '\n';
      }
      if (!bVar1) break;
      this->ptr = this->ptr + 1;
    }
    if (*this->ptr == '\0') {
      if (this->rowdesc[1].help == (char *)0x0) {
        return false;
      }
      this->rowdesc = this->rowdesc + 1;
      this->rowstart = this->rowdesc->help;
    }
    else {
      this->rowstart = this->ptr + 1;
    }
    restartRow(this);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool nextRow() {
			if (ptr == 0) {
				restartRow();
				return rowstart != 0;
			}

			while (*ptr != 0 && *ptr != '\n')
				++ptr;

			if (*ptr == 0) {
				if ((rowdesc + 1)->help == 0) // table break
					return false;

				++rowdesc;
				rowstart = rowdesc->help;
			} else // if (*ptr == '\n')
			{
				rowstart = ptr + 1;
			}

			restartRow();
			return true;
		}